

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
UnsafeArenaReleaseLast
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  int iVar1;
  Rep *pRVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  int iVar4;
  LogMessage *other;
  LogFinisher local_49;
  LogMessage local_48;
  
  iVar4 = (this->super_RepeatedPtrFieldBase).current_size_;
  if (iVar4 < 1) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x4a2);
    other = internal::LogMessage::operator<<(&local_48,"CHECK failed: (current_size_) > (0): ");
    internal::LogFinisher::operator=(&local_49,other);
    internal::LogMessage::~LogMessage(&local_48);
    iVar4 = (this->super_RepeatedPtrFieldBase).current_size_;
  }
  pRVar2 = (this->super_RepeatedPtrFieldBase).rep_;
  (this->super_RepeatedPtrFieldBase).current_size_ = iVar4 + -1;
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           pRVar2->elements[(long)iVar4 + -1];
  iVar1 = pRVar2->allocated_size;
  pRVar2->allocated_size = iVar1 + -1;
  if (iVar4 < iVar1) {
    pRVar2->elements[(long)iVar4 + -1] = pRVar2->elements[(long)iVar1 + -1];
  }
  return pbVar3;
}

Assistant:

inline Element* RepeatedPtrField<Element>::UnsafeArenaReleaseLast() {
  return RepeatedPtrFieldBase::UnsafeArenaReleaseLast<TypeHandler>();
}